

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::GetAccessors
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var *getter,Var *setter)

{
  BOOL BVar1;
  undefined8 in_RAX;
  ES5Array *arr;
  uint32 local_34 [2];
  uint32 index;
  
  local_34[0] = (uint32)((ulong)in_RAX >> 0x20);
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_34);
  if (BVar1 == 0) {
    BVar1 = DictionaryTypeHandlerBase<int>::GetAccessors
                      (&this->super_DictionaryTypeHandlerBase<int>,instance,propertyId,getter,setter
                      );
  }
  else {
    arr = VarTo<Js::ES5Array,Js::DynamicObject>(instance);
    BVar1 = GetItemAccessors(this,arr,instance,local_34[0],getter,setter);
  }
  return BVar1;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::GetAccessors(DynamicObject* instance, PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return GetItemAccessors(VarTo<ES5Array>(instance), instance, index, getter, setter);
        }

        return __super::GetAccessors(instance, propertyId, getter, setter);
    }